

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Get_Track_Kerning(FT_Face face,FT_Fixed point_size,FT_Int degree,FT_Fixed *akerning)

{
  FT_Module_Requester p_Var1;
  FT_Error FVar2;
  undefined8 *puVar3;
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else if (akerning == (FT_Fixed *)0x0) {
    FVar2 = 6;
  }
  else {
    p_Var1 = ((face->driver->root).clazz)->get_interface;
    FVar2 = 7;
    if (p_Var1 != (FT_Module_Requester)0x0) {
      puVar3 = (undefined8 *)(*p_Var1)(&face->driver->root,"kerning");
      if (puVar3 != (undefined8 *)0x0) {
        FVar2 = (*(code *)*puVar3)(face,point_size,degree,akerning);
        return FVar2;
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Track_Kerning( FT_Face    face,
                        FT_Fixed   point_size,
                        FT_Int     degree,
                        FT_Fixed*  akerning )
  {
    FT_Service_Kerning  service;
    FT_Error            error = FT_Err_Ok;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !akerning )
      return FT_THROW( Invalid_Argument );

    FT_FACE_FIND_SERVICE( face, service, KERNING );
    if ( !service )
      return FT_THROW( Unimplemented_Feature );

    error = service->get_track( face,
                                point_size,
                                degree,
                                akerning );

    return error;
  }